

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.h
# Opt level: O0

void __thiscall
jrtplib::RTPUDPv6TransmissionInfo::~RTPUDPv6TransmissionInfo(RTPUDPv6TransmissionInfo *this)

{
  RTPUDPv6TransmissionInfo *this_local;
  
  (this->super_RTPTransmissionInfo)._vptr_RTPTransmissionInfo =
       (_func_int **)&PTR__RTPUDPv6TransmissionInfo_001923a0;
  std::__cxx11::list<in6_addr,_std::allocator<in6_addr>_>::~list(&this->localIPlist);
  RTPTransmissionInfo::~RTPTransmissionInfo(&this->super_RTPTransmissionInfo);
  return;
}

Assistant:

~RTPUDPv6TransmissionInfo()								{ }